

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManComputeMappingEla(Nf_Man_t *p)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  int *piVar4;
  Nf_Obj_t *pNVar5;
  void *pvVar6;
  Mio_Cell2_t *pMVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  undefined1 *puVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  Nf_Mat_t *pNVar26;
  uint uVar27;
  Nf_Mat_t *pNVar28;
  undefined1 *puVar29;
  bool bVar30;
  Nf_Mat_t Mb;
  Nf_Mat_t local_40;
  
  Nf_ManSetOutputRequireds(p,1);
  Nf_ManResetMatches(p,p->Iter - p->pPars->nRounds);
  lVar12 = (long)p->pGia->nObjs;
  if (1 < lVar12) {
    do {
      if (p->pGia->nObjs < lVar12) goto LAB_00789d44;
      pGVar2 = p->pGia->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      lVar16 = lVar12 + -1;
      pGVar2 = pGVar2 + lVar16;
      uVar3 = *(undefined8 *)pGVar2;
      uVar11 = (uint)uVar3;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        uVar23 = lVar16 * 2;
        iVar18 = (int)lVar16;
        if ((((int)uVar11 < 0) || ((uVar11 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar11 & 0x1fffffff) != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
          lVar25 = 0;
          do {
            lVar13 = (uVar23 & 0xffffffff) + lVar25;
            if ((p->vMapRefs).nSize <= (int)lVar13) goto LAB_00789c6b;
            if ((p->vMapRefs).pArray[lVar13] != 0) {
              pNVar5 = p->pNfObjs;
              uVar11 = *(uint *)pNVar5[lVar16].M[lVar25];
              uVar19 = *(uint *)(pNVar5[lVar16].M[lVar25] + 1);
              if (-1 < (int)(uVar19 ^ uVar11)) {
LAB_00789c8a:
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                              ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              pNVar26 = (Nf_Mat_t *)0x0;
              if ((int)uVar11 < 0) {
                pNVar26 = pNVar5[lVar16].M[lVar25];
              }
              if ((int)uVar19 < 0) {
                pNVar26 = pNVar5[lVar16].M[lVar25] + 1;
              }
              if ((p->vRequired).nSize <= (int)lVar13) goto LAB_00789c6b;
              iVar15 = (p->vRequired).pArray[lVar13];
              if (iVar15 < pNVar26->D) {
                __assert_fail("pM->D <= Required",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                              ,0x7b2,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              if ((pNVar26->field_0x3 & 0x40) == 0) {
                iVar20 = (int)lVar25;
                Nf_MatchDeref_rec(p,iVar18,iVar20,pNVar26);
                if (-1 < *(int *)pNVar26) {
                  __assert_fail("pM->fBest",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x7b8,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                Nf_ManElaBestMatch(p,iVar18,iVar20,&local_40,iVar15);
                Nf_MatchRef_rec(p,iVar18,iVar20,&local_40,iVar15,(Vec_Int_t *)0x0);
                if (-1 < (int)local_40._0_4_) {
                  __assert_fail("pMb->fBest",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x7c9,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                if (iVar15 < local_40.D) {
                  __assert_fail("pMb->D <= Required",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x7ca,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                *(ulong *)pNVar26 = CONCAT44(local_40.Cfg,local_40._0_4_);
                pNVar26->D = local_40.D;
                pNVar26->F = local_40.F;
                if ((p->vCutSets).nSize < lVar12) goto LAB_00789c6b;
                uVar11 = (p->vCutSets).pArray[lVar16];
                uVar19 = (int)uVar11 >> 0x10;
                if (((int)uVar19 < 0) || ((p->vPages).nSize <= (int)uVar19)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar21 = (uint)local_40._0_4_ >> 0x14 & 0x3ff;
                if (uVar21 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                ,0x94,"int *Nf_CutFromHandle(int *, int)");
                }
                uVar11 = uVar11 & 0xffff;
                pvVar6 = (p->vPages).pArray[uVar19];
                if ((*(byte *)((long)pvVar6 + (ulong)uVar21 * 4 + (ulong)uVar11 * 4) & 0x1f) != 0) {
                  pMVar7 = p->pCells;
                  puVar1 = (uint *)((long)pvVar6 + (ulong)uVar21 * 4 + (ulong)uVar11 * 4);
                  lVar13 = (ulong)((local_40._0_4_ & 0xfffff) * 0x50) + 0x2c;
                  bVar14 = 0;
                  uVar17 = 0;
                  do {
                    uVar11 = puVar1[(ulong)(((uint)local_40.Cfg >> 8) >> (bVar14 & 0x1f) & 0xf) + 1]
                    ;
                    lVar24 = (long)(int)uVar11;
                    if (lVar24 == 0) break;
                    bVar30 = (((uint)local_40.Cfg >> 1 & 0x7f) >> ((uint)uVar17 & 0x1f) & 1) != 0;
                    pNVar5 = p->pNfObjs;
                    uVar19 = *(uint *)pNVar5[lVar24].M[bVar30];
                    uVar21 = *(uint *)(pNVar5[lVar24].M[bVar30] + 1);
                    if (-1 < (int)(uVar21 ^ uVar19)) goto LAB_00789c8a;
                    if ((int)uVar19 < 0) {
                      pNVar26 = pNVar5[lVar24].M[bVar30];
                    }
                    else {
                      pNVar26 = (Nf_Mat_t *)0x0;
                    }
                    pNVar28 = pNVar5[lVar24].M[bVar30] + 1;
                    if (-1 < (int)uVar21) {
                      pNVar28 = pNVar26;
                    }
                    iVar20 = iVar15 - *(int *)((long)pMVar7->iDelays + uVar17 * 4 + lVar13 + -0x2c);
                    if (iVar20 < ((Nf_Mat_t *)&pNVar28->field_0x0)->D) {
                      __assert_fail("pM->D <= Required - pCell->iDelays[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                    ,0x7d4,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                    }
                    if ((int)uVar11 < 0) goto LAB_00789ca9;
                    uVar19 = (uint)bVar30 + uVar11 * 2;
                    if ((p->vRequired).nSize <= (int)uVar19) goto LAB_00789c6b;
                    piVar4 = (p->vRequired).pArray;
                    if (iVar20 < piVar4[uVar19]) {
                      piVar4[uVar19] = iVar20;
                    }
                    if ((((Nf_Mat_t *)&pNVar28->field_0x0)->field_0x3 & 0x40) != 0) {
                      uVar27 = (bVar30 ^ 1) << 5;
                      uVar19 = *(uint *)(&pNVar5[lVar24].M[0][0].field_0x0 + uVar27);
                      uVar21 = *(uint *)(&pNVar5[lVar24].M[0][1].field_0x0 + uVar27);
                      if (-1 < (int)(uVar21 ^ uVar19)) goto LAB_00789c8a;
                      if ((int)uVar19 < 0) {
                        puVar22 = &pNVar5[lVar24].M[0][0].field_0x0 + uVar27;
                      }
                      else {
                        puVar22 = (undefined1 *)0x0;
                      }
                      puVar29 = &pNVar5[lVar24].M[0][1].field_0x0 + uVar27;
                      if (-1 < (int)uVar21) {
                        puVar29 = puVar22;
                      }
                      iVar20 = iVar15 - (*(int *)((long)pMVar7->iDelays +
                                                 uVar17 * 4 + lVar13 + -0x2c) + p->InvDelayI);
                      if (iVar20 < *(int *)(puVar29 + 8)) {
                        __assert_fail("pM->D <= Required - pCell->iDelays[k] - p->InvDelayI",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                                      ,0x7d9,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                      }
                      uVar11 = bVar30 ^ 1 | uVar11 * 2;
                      if ((p->vRequired).nSize <= (int)uVar11) goto LAB_00789c6b;
                      if (iVar20 < piVar4[uVar11]) {
                        piVar4[uVar11] = iVar20;
                      }
                    }
                    uVar17 = uVar17 + 1;
                    bVar14 = bVar14 + 4;
                  } while (uVar17 < (*puVar1 & 0x1f));
                }
              }
            }
            bVar30 = lVar25 == 0;
            lVar25 = lVar25 + 1;
          } while (bVar30);
        }
        else {
          uVar17 = uVar23 | 1;
          if ((long)(p->vMapRefs).nSize <= (long)uVar17) goto LAB_00789c6b;
          if ((p->vMapRefs).pArray[uVar17] != 0) {
            if ((long)(p->vRequired).nSize <= (long)uVar17) goto LAB_00789c6b;
            piVar4 = (p->vRequired).pArray;
            iVar15 = piVar4[uVar17] - p->InvDelayI;
            if (iVar15 < piVar4[lVar16 * 2]) {
              piVar4[lVar16 * 2] = iVar15;
            }
          }
          iVar15 = (p->vRequired).nSize;
          if ((long)iVar15 <= (long)uVar23) goto LAB_00789c6b;
          uVar11 = *(uint *)pGVar2;
          iVar18 = iVar18 - (uVar11 & 0x1fffffff);
          if (iVar18 < 0) {
LAB_00789ca9:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          uVar11 = (uVar11 >> 0x1d & 1) + iVar18 * 2;
          if (iVar15 <= (int)uVar11) goto LAB_00789c6b;
          piVar4 = (p->vRequired).pArray;
          if (piVar4[lVar16 * 2] < piVar4[uVar11]) {
            piVar4[uVar11] = piVar4[lVar16 * 2];
          }
        }
      }
      bVar30 = 2 < lVar12;
      lVar12 = lVar16;
    } while (bVar30);
  }
  pGVar8 = p->pGia;
  pVVar9 = pGVar8->vCis;
  if (0 < pVVar9->nSize) {
    piVar4 = pVVar9->pArray;
    iVar18 = 1;
    lVar12 = 0;
    do {
      uVar11 = piVar4[lVar12];
      uVar23 = (ulong)uVar11;
      if (((int)uVar11 < 0) || (pGVar8->nObjs <= (int)uVar11)) {
LAB_00789d44:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar23 == 0) {
        return;
      }
      lVar16 = uVar23 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar16) goto LAB_00789c6b;
      if ((p->vMapRefs).pArray[lVar16] != 0) {
        iVar15 = (p->vRequired).nSize;
        if ((iVar15 <= iVar18) || (iVar15 <= (int)(uVar23 * 2))) {
LAB_00789c6b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar10 = (p->vRequired).pArray;
        iVar15 = piVar10[lVar12 * 2 + 1] - p->InvDelayI;
        uVar23 = uVar23 * 2 & 0xffffffff;
        if (iVar15 < piVar10[uVar23]) {
          piVar10[uVar23] = iVar15;
        }
      }
      lVar12 = lVar12 + 1;
      iVar18 = iVar18 + 2;
    } while (lVar12 < pVVar9->nSize);
  }
  return;
}

Assistant:

void Nf_ManComputeMappingEla( Nf_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    Nf_Mat_t Mb, * pMb = &Mb, * pM;
    word AreaBef, AreaAft, Gain = 0;
    int i, c, iVar, Id, fCompl, k, * pCut;
    int Required;
    Nf_ManSetOutputRequireds( p, 1 );
    Nf_ManResetMatches( p, p->Iter - p->pPars->nRounds );
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Nf_ObjUpdateRequired( p, i, 0, Nf_ObjRequired(p, i, 1) - p->InvDelayI );
            Nf_ObjUpdateRequired( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj), Nf_ObjRequired(p, i, 0) );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            Required = Nf_ObjRequired( p, i, c );
            assert( pM->D <= Required );
            if ( pM->fCompl )
                continue;
            // search for a better match
            assert( !pM->fCompl );
            AreaBef = Nf_MatchDeref_rec( p, i, c, pM );
            assert( pM->fBest );
            Nf_ManElaBestMatch( p, i, c, pMb, Required );
            AreaAft = Nf_MatchRef_rec( p, i, c, pMb, Required, NULL );
            Gain += AreaBef - AreaAft;
            // print area recover progress
            if ( fVerbose && Nf_ManCell(p, pM->Gate)->pName != Nf_ManCell(p, pMb->Gate)->pName )
            {
                printf( "%4d (%d)  ", i, c );
                printf( "%8s ->%8s  ",         Nf_ManCell(p, pM->Gate)->pName, Nf_ManCell(p, pMb->Gate)->pName );
                printf( "%d -> %d  ",          Nf_ManCell(p, pM->Gate)->nFanins, Nf_ManCell(p, pMb->Gate)->nFanins );
                printf( "D: %7.2f -> %7.2f  ", Scl_Int2Flt(pM->D), Scl_Int2Flt(pMb->D) );
                printf( "R: %7.2f  ",          Required == SCL_INFINITY ? 9999.99 : Scl_Int2Flt(Required) );
                printf( "A: %7.2f -> %7.2f  ", Scl_Int2Flt((int)AreaBef), Scl_Int2Flt((int)AreaAft) );
                printf( "G: %7.2f (%7.2f) ",   Scl_Int2Flt((int)AreaBef - (int)AreaAft), Scl_Int2Flt((int)Gain) );
                printf( "\n" );
            }
            // set best match
            assert( pMb->fBest );
            assert( pMb->D <= Required );
            //assert( Scl_Flt2Int(pMb->F) == (int)AreaAft );
            //assert( AreaBef >= AreaAft );
            *pM = *pMb;
            // update timing
            pCell = Nf_ManCell( p, pMb->Gate );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pMb->CutH );
            Nf_CutForEachVarCompl( pCut, pMb->Cfg, iVar, fCompl, k )
            {
                pM = Nf_ObjMatchBest( p, iVar, fCompl );
                assert( pM->D <= Required - pCell->iDelays[k] );
                Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
                if ( pM->fCompl )
                {
                    pM = Nf_ObjMatchBest( p, iVar, !fCompl );
                    assert( pM->D <= Required - pCell->iDelays[k] - p->InvDelayI );
                    Nf_ObjUpdateRequired( p, iVar, !fCompl, Required - pCell->iDelays[k] - p->InvDelayI );
                }
            }
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            Required = Nf_ObjRequired( p, i, 1 );
            Nf_ObjUpdateRequired( p, Id, 0, Required - p->InvDelayI );
        }
}